

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

Bitset * __thiscall
diligent_spirv_cross::Compiler::combined_decoration_for_member
          (Bitset *__return_storage_ptr__,Compiler *this,SPIRType *type,uint32_t index)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  Decoration *pDVar2;
  Meta *pMVar3;
  SPIRType *type_00;
  SPIRType *pSVar4;
  __hashtable *__h;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __node_base _Var7;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_78;
  Bitset local_70;
  
  __return_storage_ptr__->lower = 0;
  puVar1 = &__return_storage_ptr__->higher;
  (__return_storage_ptr__->higher)._M_h._M_buckets =
       &(__return_storage_ptr__->higher)._M_h._M_single_bucket;
  (__return_storage_ptr__->higher)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
  (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar3 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if ((pMVar3 != (Meta *)0x0) &&
     (uVar5 = (ulong)index,
     uVar5 < (pMVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size)
     ) {
    pDVar2 = (pMVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
    __return_storage_ptr__->lower =
         __return_storage_ptr__->lower | pDVar2[uVar5].decoration_flags.lower;
    p_Var6 = pDVar2[uVar5].decoration_flags.higher._M_h._M_before_begin._M_nxt;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      do {
        local_70.lower = (uint64_t)puVar1;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (puVar1,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)(p_Var6 + 1),&local_70);
        p_Var6 = p_Var6->_M_nxt;
      } while (p_Var6 != (_Hash_node_base *)0x0);
    }
    type_00 = Variant::get<diligent_spirv_cross::SPIRType>
                        ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                         (type->member_types).
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                         .ptr[uVar5].id);
    if ((type_00->member_types).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size
        != 0) {
      uVar5 = 0;
      do {
        pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                            (type_00->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                            .ptr[uVar5].id);
        if (pSVar4->pointer == false) {
          combined_decoration_for_member(&local_70,this,type_00,(uint32_t)uVar5);
          __return_storage_ptr__->lower = __return_storage_ptr__->lower | local_70.lower;
          for (_Var7._M_nxt = local_70.higher._M_h._M_before_begin._M_nxt;
              _Var7._M_nxt != (_Hash_node_base *)0x0; _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
            local_78 = puVar1;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (puVar1,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)(_Var7._M_nxt + 1),&local_78);
          }
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_70.higher._M_h);
        }
        uVar5 = (ulong)((uint32_t)uVar5 + 1);
      } while (uVar5 < (type_00->member_types).
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                       .buffer_size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset Compiler::combined_decoration_for_member(const SPIRType &type, uint32_t index) const
{
	Bitset flags;
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &members = type_meta->members;
		if (index >= members.size())
			return flags;
		auto &dec = members[index];

		flags.merge_or(dec.decoration_flags);

		auto &member_type = get<SPIRType>(type.member_types[index]);

		// If our member type is a struct, traverse all the child members as well recursively.
		auto &member_childs = member_type.member_types;
		for (uint32_t i = 0; i < member_childs.size(); i++)
		{
			auto &child_member_type = get<SPIRType>(member_childs[i]);
			if (!child_member_type.pointer)
				flags.merge_or(combined_decoration_for_member(member_type, i));
		}
	}

	return flags;
}